

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZStack<TPZCompElSide,_10> *cellsidestack,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid,bool isIntersectEnd)

{
  byte bVar1;
  uchar uVar2;
  TPZCompMesh *mesh;
  TPZCompEl *this_00;
  undefined4 uVar3;
  undefined4 uVar4;
  TPZInterpolatedElement **ppTVar5;
  int iVar6;
  ostream *poVar7;
  TPZCompEl *this_01;
  TPZConnect *pTVar8;
  TPZGeoEl *pTVar9;
  TPZCompEl *this_02;
  long *plVar10;
  TPZCompEl *this_03;
  TPZCompEl ***pppTVar11;
  TPZCompEl **ppTVar12;
  TPZCompMesh **ppTVar13;
  _Head_base<0UL,_long,_false> extraout_RDX;
  long lVar14;
  undefined7 in_register_00000081;
  byte in_R9B;
  long lVar15;
  TPZCompElSide *celside;
  TPZCompElSide *right;
  TPZCompEl **ppTVar16;
  tuple<long,_int> tVar17;
  TPZGeoElBC gbc_1;
  TPZGeoElBC gbc;
  TPZCompElSide celside_1;
  TPZGeoElSide gleft;
  TPZManVector<TPZInterpolatedElement_*,_10> intelvec;
  TPZManVector<TPZCompEl_*,_10> wrapvec;
  
  if ((*(int *)&left->fEl == 0) || (*(int *)((long)&left->fEl + 4) == 0)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0xe1);
  }
  mesh = (TPZCompMesh *)**(undefined8 **)(CONCAT71(in_register_00000081,isIntersectEnd) + 8);
  TPZCompElSide::Reference(&gleft,(TPZCompElSide *)cellsidestack);
  this_01 = (TPZCompEl *)
            __dynamic_cast((cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                           super_TPZVec<TPZCompElSide>._vptr_TPZVec,&TPZCompEl::typeinfo,
                           &TPZInterpolatedElement::typeinfo,0);
  (**(code **)(*(long *)this_01 + 0x2f8))
            (this_01,*(undefined4 *)
                      &(cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                       super_TPZVec<TPZCompElSide>.fStore,1);
  pTVar8 = TPZInterpolatedElement::SideConnect
                     ((TPZInterpolatedElement *)this_01,0,
                      *(int *)&(cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                               super_TPZVec<TPZCompElSide>.fStore);
  TPZManVector<TPZInterpolatedElement_*,_10>::TPZManVector(&intelvec,meshvec_Hybrid->fNElements);
  if (pTVar8->fDependList != (TPZDepend *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0xf0);
  }
  right = (TPZCompElSide *)meshvec_Hybrid->fStore;
  lVar15 = meshvec_Hybrid->fNElements << 4;
  lVar14 = 0;
  while( true ) {
    if (lVar15 == 0) {
      bVar1 = (pTVar8->field_2).fCompose.fOrder;
      mesh->fDefaultOrder = (uint)bVar1;
      TPZManVector<TPZCompEl_*,_10>::TPZManVector(&wrapvec,meshvec_Hybrid->fNElements);
      ppTVar5 = intelvec.super_TPZVec<TPZInterpolatedElement_*>.fStore;
      lVar14 = intelvec.super_TPZVec<TPZInterpolatedElement_*>.fNElements << 3;
      for (lVar15 = 0; lVar14 != lVar15; lVar15 = lVar15 + 8) {
        pTVar9 = TPZCompEl::Reference(*(TPZCompEl **)((long)ppTVar5 + lVar15));
        pTVar9->fReference = (TPZCompEl *)0x0;
      }
      (**(code **)(*(long *)this_01 + 0x68))();
      (**(code **)(*(long *)this_01 + 0x2d8))(this_01,(uint)bVar1);
      TPZGeoElBC::TPZGeoElBC(&gbc,&gleft,*(int *)&left->fEl);
      this_02 = TPZCreateApproximationSpace::CreateCompEl(&mesh->fCreate,gbc.fCreatedElement,mesh);
      if ((pTVar8->field_2).fCompose.fOrder != bVar1) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                   ,0x10c);
      }
      if (this_02 == (TPZCompEl *)0x0) {
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = (long *)__dynamic_cast(this_02,&TPZCompEl::typeinfo,
                                         &TPZInterpolatedElement::typeinfo,0);
      }
      iVar6 = (**(code **)(*(long *)gbc.fCreatedElement + 0xf0))();
      (**(code **)(*plVar10 + 0x2f8))(plVar10,iVar6 + -1,1);
      pTVar9 = TPZCompEl::Reference(this_01);
      pTVar9->fReference = (TPZCompEl *)0x0;
      pTVar9 = TPZCompEl::Reference(this_02);
      pTVar9->fReference = (TPZCompEl *)0x0;
      pTVar9 = TPZCompEl::Reference(this_01);
      pTVar9->fReference = (TPZCompEl *)0x0;
      ppTVar13 = meshvec_Hybrid->fStore;
      lVar15 = meshvec_Hybrid->fNElements << 4;
      lVar14 = 0;
      while( true ) {
        if (lVar15 == 0) {
          (**(code **)(*(long *)this_02 + 0x68))();
          pppTVar11 = TPZVec<TPZCompEl_*>::begin(&wrapvec.super_TPZVec<TPZCompEl_*>);
          ppTVar16 = *pppTVar11;
          ppTVar12 = TPZVec<TPZCompEl_*>::end(&wrapvec.super_TPZVec<TPZCompEl_*>);
          for (; ppTVar16 != ppTVar12; ppTVar16 = ppTVar16 + 1) {
            (**(code **)(*(long *)*ppTVar16 + 0x68))();
          }
          TPZGeoElBC::TPZGeoElBC(&gbc,&gleft,*(int *)((long)&left->fEl + (ulong)in_R9B * 4 + 4));
          uVar3 = *(undefined4 *)&(gbc.fCreatedElement)->fIndex;
          uVar4 = *(undefined4 *)((long)&(gbc.fCreatedElement)->fIndex + 4);
          (**(code **)(*(long *)this_01 + 0x68))();
          for (lVar14 = 0; intelvec.super_TPZVec<TPZInterpolatedElement_*>.fNElements << 3 != lVar14
              ; lVar14 = lVar14 + 8) {
            (**(code **)(**(long **)((long)intelvec.super_TPZVec<TPZInterpolatedElement_*>.fStore +
                                    lVar14) + 0x68))();
          }
          this->fHDivWrapMatid = (uint)bVar1;
          this->fLagrangeInterfaceEnd = uVar3;
          (this->fInterfaceMatid).first = uVar4;
          TPZManVector<TPZCompEl_*,_10>::~TPZManVector(&wrapvec);
          TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector(&intelvec);
          tVar17.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
               extraout_RDX._M_head_impl;
          tVar17.super__Tuple_impl<0UL,_long,_int>._0_8_ = this;
          return (tuple<long,_int>)tVar17.super__Tuple_impl<0UL,_long,_int>;
        }
        celside_1.fEl = (TPZCompEl *)*ppTVar13;
        celside_1.fSide = *(int *)(ppTVar13 + 1);
        this_00 = *(TPZCompEl **)
                   ((long)intelvec.super_TPZVec<TPZInterpolatedElement_*>.fStore + lVar14);
        (**(code **)(*(long *)this_00 + 0x68))(this_00);
        pTVar8 = TPZInterpolatedElement::SideConnect
                           ((TPZInterpolatedElement *)this_00,0,celside_1.fSide);
        uVar2 = (pTVar8->field_2).fCompose.fOrder;
        (**(code **)(*(long *)this_00 + 0x2d8))(this_00,uVar2);
        TPZCompElSide::Reference((TPZGeoElSide *)&gbc,&celside_1);
        TPZGeoElBC::TPZGeoElBC(&gbc_1,(TPZGeoElSide *)&gbc,*(int *)&left->fEl);
        this_03 = TPZCreateApproximationSpace::CreateCompEl
                            (&mesh->fCreate,gbc_1.fCreatedElement,mesh);
        *(TPZCompEl **)((long)wrapvec.super_TPZVec<TPZCompEl_*>.fStore + lVar14) = this_03;
        if ((pTVar8->field_2).fCompose.fOrder != uVar2) break;
        if (this_03 == (TPZCompEl *)0x0) {
          plVar10 = (long *)0x0;
        }
        else {
          plVar10 = (long *)__dynamic_cast(this_03,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0);
        }
        iVar6 = (**(code **)(*(long *)gbc_1.fCreatedElement + 0xf0))();
        (**(code **)(*plVar10 + 0x2f8))(plVar10,iVar6 + -1,1);
        pTVar9 = TPZCompEl::Reference(this_00);
        pTVar9->fReference = (TPZCompEl *)0x0;
        pTVar9 = TPZCompEl::Reference(this_03);
        pTVar9->fReference = (TPZCompEl *)0x0;
        ppTVar13 = ppTVar13 + 2;
        lVar14 = lVar14 + 8;
        lVar15 = lVar15 + -0x10;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                 ,0x124);
    }
    TPZCompElSide::SplitConnect((TPZCompElSide *)cellsidestack,right);
    if (right->fEl == (TPZCompEl *)0x0) break;
    plVar10 = (long *)__dynamic_cast(right->fEl,&TPZCompEl::typeinfo,
                                     &TPZInterpolatedElement::typeinfo,0);
    if (plVar10 == (long *)0x0) break;
    (**(code **)(*plVar10 + 0x2f8))(plVar10,right->fSide,1);
    *(long **)((long)intelvec.super_TPZVec<TPZInterpolatedElement_*>.fStore + lVar14) = plVar10;
    right = right + 1;
    lVar14 = lVar14 + 8;
    lVar15 = lVar15 + -0x10;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
             ,0xf8);
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZStack<TPZCompElSide> &cellsidestack, TPZVec<TPZCompMesh *> &meshvec_Hybrid, const bool isIntersectEnd) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    
    // All left connect needed variables
    TPZGeoElSide gleft(left.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());
    
    TPZManVector<TPZInterpolatedElement*> intelvec(cellsidestack.size());
    int count = 0;
    if (cleft.HasDependency()){
        DebugStop(); // Please implement me!
    }
    else {
        for (auto& celside : cellsidestack){
            left.SplitConnect(celside);
            
            TPZInterpolatedElement *inteltochange = dynamic_cast<TPZInterpolatedElement *> (celside.Element());
            if (!inteltochange)
                DebugStop();
            inteltochange->SetSideOrient(celside.Side(), 1);
            intelvec[count++] = inteltochange;
        }
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
            
    // Create HdivBound first for left element
    TPZCompEl *wrapleft;
    TPZManVector<TPZCompEl*> wrapvec(cellsidestack.size());
    {
        for (TPZCompEl* cel : intelvec)
            cel->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid); // creates geoelbc for side
        wrapleft = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrapleft);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrapleft->Reference()->ResetReference();
    }
    
    // Create HdivBound then for all others
    intelleft->Reference()->ResetReference();
    int i = 0;
    for (TPZCompElSide celside : cellsidestack) {
        TPZInterpolatedElement* intel = intelvec[i];
        intel->LoadElementReference();
        TPZConnect &con = intel->SideConnect(0, celside.Side());
        int prevorder = con.Order();
        intel->SetPreferredOrder(con.Order());
        
        TPZGeoElSide gelside(celside.Reference());
        TPZGeoElBC gbc(gelside,fHDivWrapMatid);
        TPZCompEl* wrap = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        wrapvec[i++] = wrap;
        if (con.Order() != prevorder)
            DebugStop();
        
        TPZInterpolatedElement* intelwrap = dynamic_cast<TPZInterpolatedElement*>(wrap);
        int wrapside = gbc.CreatedElement()->NSides()-1;
        intelwrap->SetSideOrient(wrapside, 1);
        intel->Reference()->ResetReference();
        wrap->Reference()->ResetReference();
    }
    wrapleft->LoadElementReference();
    for (TPZCompEl* wrap : wrapvec)
        wrap->LoadElementReference();
    
    int64_t pressureindex;
    int pressureorder;
    int lagmatid = fLagrangeInterface;
    if (isIntersectEnd) {
        lagmatid = fLagrangeInterfaceEnd;
    }
    {
      TPZGeoElBC gbc(gleft, lagmatid);
      pressureindex = gbc.CreatedElement()->Index();
      pressureorder = sideorder;
    }
    
    intelleft->LoadElementReference();
    for (TPZInterpolatedElement* intel : intelvec)
        intel->LoadElementReference();
    
    return std::make_tuple(pressureindex,pressureorder);
}